

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O3

int32_t __thiscall cppnet::BufferQueue::MoveWritePt(BufferQueue *this,int32_t len)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  element_type *peVar6;
  int iVar7;
  bool bVar8;
  
  peVar6 = (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (len < 0) {
    if (peVar6 != (element_type *)0x0) {
      iVar7 = 0;
      do {
        iVar3 = (*(peVar6->super_InnerBuffer).super_Buffer._vptr_Buffer[0xe])
                          (peVar6,(ulong)(uint)(len + iVar7));
        iVar7 = iVar3 + iVar7;
        peVar6 = (this->_buffer_list)._head.
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var5 = (this->_buffer_list)._head.
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          peVar4 = (this->_buffer_write).
                   super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar4 == peVar6) || (SBORROW4(iVar7,-len) == iVar7 + len < 0)) break;
        }
        else {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          }
          peVar4 = (this->_buffer_write).
                   super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
          if ((peVar4 == peVar6) || (SBORROW4(iVar7,-len) == iVar7 + len < 0)) break;
          peVar4 = (this->_buffer_write).
                   super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        p_Var5 = (peVar4->super_ListSlot<cppnet::BufferBlock>)._prev.
                 super___weak_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
        if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_0011a77c:
          p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_0011a77e:
          peVar6 = (element_type *)0x0;
        }
        else {
          iVar3 = p_Var5->_M_use_count;
          do {
            if (iVar3 == 0) goto LAB_0011a77c;
            LOCK();
            iVar1 = p_Var5->_M_use_count;
            bVar8 = iVar3 == iVar1;
            if (bVar8) {
              p_Var5->_M_use_count = iVar3 + 1;
              iVar1 = iVar3;
            }
            iVar3 = iVar1;
            UNLOCK();
          } while (!bVar8);
          if (p_Var5->_M_use_count == 0) goto LAB_0011a77e;
          peVar6 = (peVar4->super_ListSlot<cppnet::BufferBlock>)._prev.
                   super___weak_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = peVar6;
        p_Var2 = (this->_buffer_write).
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var5;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
          peVar6 = (this->_buffer_write).
                   super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
      } while (peVar6 != (element_type *)0x0);
      goto LAB_0011a7ab;
    }
  }
  else if (peVar6 != (element_type *)0x0) {
    iVar7 = 0;
    do {
      iVar3 = (*(peVar6->super_InnerBuffer).super_Buffer._vptr_Buffer[0xe])
                        (peVar6,(ulong)(uint)(len - iVar7));
      iVar7 = iVar3 + iVar7;
      peVar6 = (this->_buffer_list)._tail.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var5 = (this->_buffer_list)._tail.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var5 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        peVar4 = (this->_buffer_write).
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar4 == peVar6) || (len <= iVar7)) break;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
        peVar4 = (this->_buffer_write).
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
        if ((peVar4 == peVar6) || (len <= iVar7)) break;
        peVar4 = (this->_buffer_write).
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
      peVar6 = (peVar4->super_ListSlot<cppnet::BufferBlock>)._next.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var5 = (peVar4->super_ListSlot<cppnet::BufferBlock>)._next.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        }
      }
      (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = peVar6;
      p_Var2 = (this->_buffer_write).
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      (this->_buffer_write).super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var5;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
        peVar6 = (this->_buffer_write).
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      }
    } while (peVar6 != (element_type *)0x0);
    goto LAB_0011a7ab;
  }
  iVar7 = 0;
LAB_0011a7ab:
  this->_can_read_length = this->_can_read_length + iVar7;
  return iVar7;
}

Assistant:

int32_t BufferQueue::MoveWritePt(int32_t len) {
    int32_t total_write_len = 0;
    if (len >= 0) {
        while (_buffer_write) {
            total_write_len += _buffer_write->MoveWritePt(len - total_write_len);
            if (_buffer_write == _buffer_list.GetTail() || len <= total_write_len) {
                break;
            }
            _buffer_write = _buffer_write->GetNext();
        }

    } else {
        while (_buffer_write) {
            total_write_len += _buffer_write->MoveWritePt(len + total_write_len);
            if (_buffer_write == _buffer_list.GetHead() || -len <= total_write_len) {
                break;
            }
            _buffer_write = _buffer_write->GetPrev();
        }
    }
    _can_read_length += total_write_len;
    return total_write_len;
}